

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

int EmitParameter(VMFunctionBuilder *build,FxExpression *operand,FScriptPosition *pos)

{
  uint uVar1;
  uint extraout_var;
  uint opb;
  byte bVar2;
  
  uVar1 = (*operand->_vptr_FxExpression[9])(operand,build);
  bVar2 = (byte)(uVar1 >> 0x10);
  if (bVar2 == 0x80) {
    FScriptPosition::Message(pos,2,"Attempted to pass a non-value");
    VMFunctionBuilder::Emit(build,0x46,0,0x80,uVar1 & 0xffff);
    uVar1 = 1;
  }
  else {
    opb = uVar1 >> 0x10 & 0xff;
    if ((extraout_var & 1) == 0) {
      if ((char)(uVar1 >> 0x18) == '\x03') {
        opb = opb | 0x10;
      }
      else if (uVar1 >> 0x18 == 2) {
        opb = opb | 8;
      }
    }
    else {
      opb = opb | 4;
    }
    VMFunctionBuilder::Emit(build,0x46,0,opb,uVar1 & 0xffff);
    if ((extraout_var & 0x101) == 0 && bVar2 < 4) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + ((uint)(CONCAT44(extraout_var,uVar1) >> 0x10) & 3),
                 uVar1 & 0xffff,uVar1 >> 0x18);
    }
    uVar1 = (uint)(CONCAT44(extraout_var,uVar1) >> 0x18) & 0xff;
  }
  return uVar1;
}

Assistant:

static int EmitParameter(VMFunctionBuilder *build, FxExpression *operand, const FScriptPosition &pos)
{
	ExpEmit where = operand->Emit(build);

	if (where.RegType == REGT_NIL)
	{
		pos.Message(MSG_ERROR, "Attempted to pass a non-value");
		build->Emit(OP_PARAM, 0, where.RegType, where.RegNum);
		return 1;
	}
	else
	{
		build->Emit(OP_PARAM, 0, EncodeRegType(where), where.RegNum);
		where.Free(build);
		return where.RegCount;
	}
}